

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O3

void __thiscall CSocekt::DeleteFromTimerQueue(CSocekt *this,lp_connection_t pConn)

{
  _Rb_tree_header *p_Var1;
  CMemory *this_00;
  iterator __position;
  iterator pos;
  _Base_ptr p_Var2;
  
  this_00 = CMemory::GetInstance();
  muduo::MutexLock::lock(&this->m_timequeueMutex);
  p_Var1 = &(this->m_timerQueuemap)._M_t._M_impl.super__Rb_tree_header;
  __position._M_node = (this->m_timerQueuemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = __position._M_node;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      while (*(lp_connection_t *)__position._M_node[1]._M_parent == pConn) {
        CMemory::FreeMemory(this_00,__position._M_node[1]._M_parent);
        std::
        _Rb_tree<long,std::pair<long_const,_STRUC_MSG_HEADER*>,std::_Select1st<std::pair<long_const,_STRUC_MSG_HEADER*>>,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,_STRUC_MSG_HEADER*>,std::_Select1st<std::pair<long_const,_STRUC_MSG_HEADER*>>,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
                            *)&this->m_timerQueuemap,__position);
        this->m_cur_size_ = this->m_cur_size_ - 1;
        __position._M_node =
             (this->m_timerQueuemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var2 = __position._M_node;
        if ((_Rb_tree_header *)__position._M_node == p_Var1) goto LAB_001168d0;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
LAB_001168d0:
  if (this->m_cur_size_ != 0) {
    this->m_timer_value_ = *(time_t *)(p_Var2 + 1);
  }
  (this->m_timequeueMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_timequeueMutex);
  return;
}

Assistant:

void CSocekt::DeleteFromTimerQueue(lp_connection_t pConn)
{
    std::multimap<time_t, LPSTRUC_MSG_HEADER>::iterator pos,posend;
	CMemory *p_memory = CMemory::GetInstance();

    muduo::MutexLockGuard lock(m_timequeueMutex);

    //因为实际情况可能比较复杂，将来可能还扩充代码等等，所以如下我们遍历整个队列找 一圈，而不是找到一次就拉倒，以免出现什么遗漏
lblMTQM:
	pos    = m_timerQueuemap.begin();
	posend = m_timerQueuemap.end();
	for(; pos != posend; ++pos)	
	{
		if(pos->second->pConn == pConn)
		{			
			p_memory->FreeMemory(pos->second);  //释放内存
			m_timerQueuemap.erase(pos);
			--m_cur_size_; //减去一个元素，必然要把尺寸减少1个;								
			goto lblMTQM;
		}		
	}
	if(m_cur_size_ > 0)
	{
		m_timer_value_ = GetEarliestTime();
	}
    return;    
}